

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gausschebyshev2.hpp
# Opt level: O2

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::quadrature_traits<IntegratorXX::GaussChebyshev2<double,_double>,_void>::generate
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,size_t npts)

{
  long lVar1;
  size_t idx;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  point_container points;
  weight_container weights;
  allocator_type local_71;
  _Vector_base<double,_std::allocator<double>_> local_70;
  double local_58;
  _Vector_base<double,_std::allocator<double>_> local_50;
  double local_38;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_50,npts,(allocator_type *)&local_70);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_70,npts,&local_71);
  lVar1 = npts + 1;
  auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar7._0_8_ = lVar1;
  auVar7._12_4_ = 0x45300000;
  local_58 = 3.141592653589793 /
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
  uVar4 = npts >> 1;
  sVar3 = npts;
  for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    auVar8._8_4_ = (int)(sVar3 >> 0x20);
    auVar8._0_8_ = sVar3;
    auVar8._12_4_ = 0x45300000;
    dVar5 = cos(((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) * local_58);
    dVar6 = 1.0 - dVar5 * dVar5;
    if (dVar6 < 0.0) {
      local_38 = dVar5;
      dVar6 = sqrt(dVar6);
      dVar5 = local_38;
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    local_70._M_impl.super__Vector_impl_data._M_start[uVar2] = dVar5;
    local_50._M_impl.super__Vector_impl_data._M_start[uVar2] = dVar6 * local_58;
    local_70._M_impl.super__Vector_impl_data._M_start[sVar3 - 1] = -dVar5;
    local_50._M_impl.super__Vector_impl_data._M_start[sVar3 - 1] = dVar6 * local_58;
    sVar3 = sVar3 - 1;
  }
  if ((npts & 1) != 0) {
    local_70._M_impl.super__Vector_impl_data._M_start[uVar4] = 0.0;
    local_50._M_impl.super__Vector_impl_data._M_start[uVar4] = local_58;
  }
  std::
  _Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_70,
             (vector<double,_std::allocator<double>_> *)&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container, weight_container> generate(size_t npts) {
    const weight_type pi_ov_npts_p_1 = M_PI / (npts + 1);

    weight_container weights(npts);
    point_container points(npts);

    // Generate the first half explicitly and reflect
    for(size_t idx = 0; idx < npts/2; ++idx) {
      // Transform index here for two reasons: the mathematical
      // equations are for 1 <= i <= n, and the nodes are generated in
      // decreasing order. This generates them in the right order
      size_t i = npts - idx;

      // The standard nodes are given by
      const auto ti = i * pi_ov_npts_p_1;
      const auto xi = std::cos(ti);

      // The quadrature weight, transformed to unit weight factor in
      // [-1,1] is given by (see comments above for explanation)
      const auto wi = pi_ov_npts_p_1 * std::sqrt(1.0 - xi * xi);

      // Store into memory
      points[idx] = xi;
      weights[idx] = wi;

      // Reflect to second half
      points[i-1]  = -xi;
      weights[i-1] = wi; 
    }

    // Edge case for odd points
    if(npts % 2) {
      points[npts/2]  = 0.0;
      weights[npts/2] = pi_ov_npts_p_1;
    }

    return std::make_tuple(points, weights);
  }